

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntaxAnalysis.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* condition(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *__return_storage_ptr__,function *fn,string *label,
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *intermediateInner)

{
  tokenCategory op;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference __x;
  int local_10c;
  __cxx11 local_108 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  string local_c8 [8];
  string vt2;
  __cxx11 local_a0 [4];
  tokenCategory relation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [48];
  string local_50 [8];
  string vt1;
  int pos1;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *intermediateInner_local;
  string *label_local;
  function *fn_local;
  
  sVar3 = std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::size(&intermediateCodeInner_abi_cxx11_);
  local_10c = (int)sVar3;
  std::__cxx11::string::string(local_50);
  iVar2 = expression(fn,(string *)local_50);
  bVar1 = expressTypeEqual(iVar2,CHARTK);
  if (bVar1) {
    sVar3 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::size(&formerAns_abi_cxx11_);
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::at(&formerAns_abi_cxx11_,~(long)tokenPointer + sVar3);
    std::__cxx11::to_string(local_a0,pvVar4->second);
    std::operator+(local_80,(char *)local_a0);
    error_syntax(local_80);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)local_a0);
  }
  getToken();
  op = Token;
  getToken();
  std::__cxx11::string::string(local_c8);
  iVar2 = expression(fn,(string *)local_c8);
  bVar1 = expressTypeEqual(iVar2,CHARTK);
  if (bVar1) {
    sVar3 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::size(&formerAns_abi_cxx11_);
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::at(&formerAns_abi_cxx11_,~(long)tokenPointer + sVar3);
    std::__cxx11::to_string(local_108,pvVar4->second);
    std::operator+(local_e8,(char *)local_108);
    error_syntax(local_e8);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)local_108);
  }
  for (; sVar3 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::size(&intermediateCodeInner_abi_cxx11_), (ulong)(long)local_10c < sVar3;
      local_10c = local_10c + 1) {
    __x = std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::at(&intermediateCodeInner_abi_cxx11_,(long)local_10c);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(intermediateInner,__x);
  }
  addCondition(__return_storage_ptr__,(string *)local_50,(string *)local_c8,label,op);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

vector<string>
condition(function &fn, string &label, vector<vector<string>> &intermediateInner) {//条件
    int pos1 = intermediateCodeInner.size();
    string vt1;
    if (expressTypeEqual(expression(fn, vt1), CHARTK)) {
        error_syntax(to_string(formerAns.at(formerAns.size() - 1 - tokenPointer).second) + " f");
    }
    getToken();//isRelation();
    enum tokenCategory relation = Token;
    getToken();
    string vt2;
    if (expressTypeEqual(expression(fn, vt2), CHARTK)) {
        error_syntax(to_string(formerAns.at(formerAns.size() - 1 - tokenPointer).second) + " f");
    }
    for (int i = pos1; i < intermediateCodeInner.size(); i++) {
        intermediateInner.push_back(intermediateCodeInner.at(i));
    }
    //outputAns.emplace_back(syntaxCategoryString[23]);
    return addCondition(vt1, vt2, label, relation);
}